

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::Utils::shaderCompilationException::shaderCompilationException
          (shaderCompilationException *this,GLchar *source,GLchar *message)

{
  allocator<char> local_1a;
  allocator<char> local_19;
  
  *(undefined ***)this = &PTR__shaderCompilationException_01e070a0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_shader_source,source,&local_19);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_error_message,message,&local_1a);
  return;
}

Assistant:

Utils::shaderCompilationException::shaderCompilationException(const glw::GLchar* source, const glw::GLchar* message)
	: m_shader_source(source), m_error_message(message)
{
	/* Nothing to be done */
}